

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

ExprModule * AnalyzeModuleFromSource(CompilerContext *ctx)

{
  int iVar1;
  uint uVar2;
  SynModule *pSVar3;
  void *pvVar4;
  size_t sVar5;
  ExprModule *pEVar6;
  undefined1 local_a0 [8];
  ExpressionGraphContext exprGraphCtx;
  TraceScope traceScope_2;
  uint errorLength;
  ExpressionContext *exprCtx;
  undefined1 local_60 [8];
  ParseGraphContext parseGraphCtx;
  TraceScope traceScope_1;
  ParseContext *parseCtx;
  TraceScope traceScope;
  CompilerContext *ctx_local;
  
  if ((AnalyzeModuleFromSource(CompilerContext&)::token == '\0') &&
     (iVar1 = __cxa_guard_acquire(&AnalyzeModuleFromSource(CompilerContext&)::token), iVar1 != 0)) {
    AnalyzeModuleFromSource::token = NULLC::TraceGetToken("compiler","AnalyzeModuleFromSource");
    __cxa_guard_release(&AnalyzeModuleFromSource(CompilerContext&)::token);
  }
  NULLC::TraceScope::TraceScope((TraceScope *)&parseCtx,AnalyzeModuleFromSource::token);
  (ctx->parseCtx).bytecodeBuilder = BuildModuleFromPath;
  (ctx->parseCtx).errorBuf = ctx->errorBuf;
  (ctx->parseCtx).errorBufSize = ctx->errorBufSize;
  pSVar3 = Parse(&ctx->parseCtx,ctx->code,ctx->moduleRoot);
  ctx->synModule = pSVar3;
  CompilerStatistics::Add(&ctx->statistics,&(ctx->parseCtx).statistics);
  uVar2 = NULLCTime::clockMicro();
  CompilerStatistics::Start(&ctx->statistics,uVar2);
  if (((ctx->enableLogFiles & 1U) != 0) && (ctx->synModule != (SynModule *)0x0)) {
    if ((AnalyzeModuleFromSource(CompilerContext&)::token == '\0') &&
       (iVar1 = __cxa_guard_acquire(&AnalyzeModuleFromSource(CompilerContext&)::token), iVar1 != 0))
    {
      AnalyzeModuleFromSource(CompilerContext&)::token =
           NULLC::TraceGetToken("compiler","Debug::syntax_graph");
      __cxa_guard_release(&AnalyzeModuleFromSource(CompilerContext&)::token);
    }
    NULLC::TraceScope::TraceScope
              ((TraceScope *)&parseGraphCtx.depth,AnalyzeModuleFromSource(CompilerContext&)::token);
    if ((ctx->outputCtx).stream != (void *)0x0) {
      __assert_fail("!ctx.outputCtx.stream",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Compiler.cpp"
                    ,0x1ad,"ExprModule *AnalyzeModuleFromSource(CompilerContext &)");
    }
    pvVar4 = (*(ctx->outputCtx).openStream)("syntax_graph.txt");
    (ctx->outputCtx).stream = pvVar4;
    if ((ctx->outputCtx).stream != (void *)0x0) {
      ParseGraphContext::ParseGraphContext((ParseGraphContext *)local_60,&ctx->outputCtx);
      PrintGraph((ParseGraphContext *)local_60,&ctx->synModule->super_SynBase,"");
      (*(ctx->outputCtx).closeStream)((ctx->outputCtx).stream);
      (ctx->outputCtx).stream = (void *)0x0;
    }
    NULLC::TraceScope::~TraceScope((TraceScope *)&parseGraphCtx.depth);
  }
  uVar2 = NULLCTime::clockMicro();
  CompilerStatistics::Finish(&ctx->statistics,"Logging",uVar2);
  if (ctx->synModule == (SynModule *)0x0) {
    if ((ctx->parseCtx).errorPos != (char *)0x0) {
      ctx->errorPos = (ctx->parseCtx).errorPos;
    }
    ctx_local = (CompilerContext *)0x0;
  }
  else {
    (ctx->exprCtx).memoryLimit = ctx->exprMemoryLimit;
    (ctx->exprCtx).errorBuf = ctx->errorBuf;
    (ctx->exprCtx).errorBufSize = ctx->errorBufSize;
    if ((ctx->parseCtx).errorPos != (char *)0x0) {
      sVar5 = strlen((ctx->exprCtx).errorBuf);
      (ctx->exprCtx).errorBuf = (ctx->exprCtx).errorBuf + (sVar5 & 0xffffffff);
      (ctx->exprCtx).errorBufSize = (ctx->exprCtx).errorBufSize - (int)sVar5;
    }
    pEVar6 = Analyze(&ctx->exprCtx,ctx->synModule,ctx->code,ctx->moduleRoot);
    ctx->exprModule = pEVar6;
    CompilerStatistics::Add(&ctx->statistics,&(ctx->exprCtx).statistics);
    uVar2 = NULLCTime::clockMicro();
    CompilerStatistics::Start(&ctx->statistics,uVar2);
    if (((ctx->enableLogFiles & 1U) != 0) && (ctx->exprModule != (ExprModule *)0x0)) {
      if ((AnalyzeModuleFromSource(CompilerContext&)::token == '\0') &&
         (iVar1 = __cxa_guard_acquire(&AnalyzeModuleFromSource(CompilerContext&)::token), iVar1 != 0
         )) {
        AnalyzeModuleFromSource(CompilerContext&)::token =
             NULLC::TraceGetToken("compiler","Debug::expr_graph");
        __cxa_guard_release(&AnalyzeModuleFromSource(CompilerContext&)::token);
      }
      NULLC::TraceScope::TraceScope
                ((TraceScope *)&exprGraphCtx.depth,AnalyzeModuleFromSource(CompilerContext&)::token)
      ;
      if ((ctx->outputCtx).stream != (void *)0x0) {
        __assert_fail("!ctx.outputCtx.stream",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Compiler.cpp"
                      ,0x1e0,"ExprModule *AnalyzeModuleFromSource(CompilerContext &)");
      }
      pvVar4 = (*(ctx->outputCtx).openStream)("expr_graph.txt");
      (ctx->outputCtx).stream = pvVar4;
      if ((ctx->outputCtx).stream != (void *)0x0) {
        ExpressionGraphContext::ExpressionGraphContext
                  ((ExpressionGraphContext *)local_a0,&ctx->exprCtx,&ctx->outputCtx);
        PrintGraph((ExpressionGraphContext *)local_a0,&ctx->exprModule->super_ExprBase,"");
        (*(ctx->outputCtx).closeStream)((ctx->outputCtx).stream);
        (ctx->outputCtx).stream = (void *)0x0;
      }
      NULLC::TraceScope::~TraceScope((TraceScope *)&exprGraphCtx.depth);
    }
    uVar2 = NULLCTime::clockMicro();
    CompilerStatistics::Finish(&ctx->statistics,"Logging",uVar2);
    if (((ctx->exprModule == (ExprModule *)0x0) || ((ctx->exprCtx).errorCount != 0)) ||
       ((ctx->parseCtx).errorCount != 0)) {
      if ((ctx->parseCtx).errorPos == (char *)0x0) {
        if ((ctx->exprCtx).errorPos != (char *)0x0) {
          ctx->errorPos = (ctx->exprCtx).errorPos;
        }
      }
      else {
        ctx->errorPos = (ctx->parseCtx).errorPos;
      }
      ctx_local = (CompilerContext *)0x0;
    }
    else {
      ctx_local = (CompilerContext *)ctx->exprModule;
    }
  }
  NULLC::TraceScope::~TraceScope((TraceScope *)&parseCtx);
  return (ExprModule *)ctx_local;
}

Assistant:

ExprModule* AnalyzeModuleFromSource(CompilerContext &ctx)
{
	TRACE_SCOPE("compiler", "AnalyzeModuleFromSource");

	ParseContext &parseCtx = ctx.parseCtx;

	parseCtx.bytecodeBuilder = BuildModuleFromPath;

	parseCtx.errorBuf = ctx.errorBuf;
	parseCtx.errorBufSize = ctx.errorBufSize;

	ctx.synModule = Parse(parseCtx, ctx.code, ctx.moduleRoot);

	ctx.statistics.Add(ctx.parseCtx.statistics);

	ctx.statistics.Start(NULLCTime::clockMicro());

	if(ctx.enableLogFiles && ctx.synModule)
	{
		TRACE_SCOPE("compiler", "Debug::syntax_graph");

		assert(!ctx.outputCtx.stream);
		ctx.outputCtx.stream = ctx.outputCtx.openStream("syntax_graph.txt");
		
		if(ctx.outputCtx.stream)
		{
			ParseGraphContext parseGraphCtx(ctx.outputCtx);

			PrintGraph(parseGraphCtx, ctx.synModule, "");

			ctx.outputCtx.closeStream(ctx.outputCtx.stream);
			ctx.outputCtx.stream = NULL;
		}
	}

	ctx.statistics.Finish("Logging", NULLCTime::clockMicro());

	if(!ctx.synModule)
	{
		if(parseCtx.errorPos)
			ctx.errorPos = parseCtx.errorPos;

		return NULL;
	}

	//printf("# Parse memory %dkb\n", ctx.allocator->requested() / 1024);

	ExpressionContext &exprCtx = ctx.exprCtx;

	exprCtx.memoryLimit = ctx.exprMemoryLimit;

	exprCtx.errorBuf = ctx.errorBuf;
	exprCtx.errorBufSize = ctx.errorBufSize;

	if(parseCtx.errorPos)
	{
		unsigned errorLength = unsigned(strlen(exprCtx.errorBuf));

		exprCtx.errorBuf += errorLength;
		exprCtx.errorBufSize -= errorLength;
	}

	ctx.exprModule = Analyze(exprCtx, ctx.synModule, ctx.code, ctx.moduleRoot);

	ctx.statistics.Add(ctx.exprCtx.statistics);

	ctx.statistics.Start(NULLCTime::clockMicro());

	if(ctx.enableLogFiles && ctx.exprModule)
	{
		TRACE_SCOPE("compiler", "Debug::expr_graph");

		assert(!ctx.outputCtx.stream);
		ctx.outputCtx.stream = ctx.outputCtx.openStream("expr_graph.txt");

		if(ctx.outputCtx.stream)
		{
			ExpressionGraphContext exprGraphCtx(ctx.exprCtx, ctx.outputCtx);

			PrintGraph(exprGraphCtx, ctx.exprModule, "");

			ctx.outputCtx.closeStream(ctx.outputCtx.stream);
			ctx.outputCtx.stream = NULL;
		}
	}

	ctx.statistics.Finish("Logging", NULLCTime::clockMicro());

	if(!ctx.exprModule || exprCtx.errorCount != 0 || parseCtx.errorCount != 0)
	{
		if(parseCtx.errorPos)
			ctx.errorPos = parseCtx.errorPos;
		else if(exprCtx.errorPos)
			ctx.errorPos = exprCtx.errorPos;

		return NULL;
	}

	//printf("# Compile memory %dkb\n", ctx.allocator->requested() / 1024);

	return ctx.exprModule;
}